

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_xscmpexpdp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xa,ppc_vsr_t *xb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uintptr_t unaff_retaddr;
  
  iVar3 = 1;
  if (((xa->u64[1] & 0x7fffffffffffffff) < 0x7ff0000000000001) &&
     ((xb->u64[1] & 0x7fffffffffffffff) < 0x7ff0000000000001)) {
    uVar1 = (uint)(xa->u64[1] >> 0x34) & 0x7ff;
    uVar2 = (uint)(xb->u64[1] >> 0x34) & 0x7ff;
    if (uVar1 < uVar2) {
      iVar3 = 8;
    }
    else {
      iVar3 = (uint)(uVar2 < uVar1) * 2 + 2;
    }
  }
  env->fpscr = iVar3 << 0xc | env->fpscr & 0xffff0fff;
  *(int *)((long)env->crf + (ulong)(opcode >> 0x15 & 0x1c)) = iVar3;
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xscmpexpdp(CPUPPCState *env, uint32_t opcode,
                       ppc_vsr_t *xa, ppc_vsr_t *xb)
{
    int64_t exp_a, exp_b;
    uint32_t cc;

    exp_a = extract64(xa->VsrD(0), 52, 11);
    exp_b = extract64(xb->VsrD(0), 52, 11);

    if (unlikely(float64_is_any_nan(xa->VsrD(0)) ||
                 float64_is_any_nan(xb->VsrD(0)))) {
        cc = CRF_SO;
    } else {
        if (exp_a < exp_b) {
            cc = CRF_LT;
        } else if (exp_a > exp_b) {
            cc = CRF_GT;
        } else {
            cc = CRF_EQ;
        }
    }

    env->fpscr &= ~FP_FPCC;
    env->fpscr |= cc << FPSCR_FPCC;
    env->crf[BF(opcode)] = cc;

    do_float_check_status(env, GETPC());
}